

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O0

size_t __thiscall
frozen::unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_>::count<int>
          (unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  const_iterator pvVar1;
  const_iterator pvVar2;
  int *key_local;
  unordered_map<int,_int,_128UL,_frozen::elsa<int>,_std::equal_to<int>_> *this_local;
  
  pvVar1 = find<int>(this,key);
  pvVar2 = end(this);
  return (ulong)(pvVar1 != pvVar2);
}

Assistant:

constexpr std::size_t count(KeyType const &key) const {
    return find(key) != end();
  }